

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

uint32_t VP8GetValue(VP8BitReader *br,int bits)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint32_t v;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = 0;
  while (0 < bits) {
    uVar6 = br->range;
    iVar2 = br->bits;
    if (iVar2 < 0) {
      VP8LoadNewBytes(br);
      iVar2 = br->bits;
    }
    uVar3 = uVar6 >> 1 & 0xffffff;
    uVar5 = (uint)(br->value >> ((byte)iVar2 & 0x3f));
    if (uVar3 < uVar5) {
      uVar6 = uVar6 - uVar3;
      br->value = br->value - ((ulong)uVar3 + 1 << ((byte)iVar2 & 0x3f));
    }
    else {
      uVar6 = uVar3 + 1;
    }
    bits = bits + -1;
    uVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    br->bits = iVar2 - (uVar1 ^ 7);
    br->range = (uVar6 << ((byte)(uVar1 ^ 7) & 0x1f)) - 1;
    uVar4 = uVar4 | (uint)(uVar3 < uVar5) << ((byte)bits & 0x1f);
  }
  return uVar4;
}

Assistant:

uint32_t VP8GetValue(VP8BitReader* const br, int bits, const char label[]) {
  uint32_t v = 0;
  while (bits-- > 0) {
    v |= VP8GetBit(br, 0x80, label) << bits;
  }
  return v;
}